

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eigen.h
# Opt level: O3

bool __thiscall
pybind11::detail::
type_caster<Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_void>
::load(type_caster<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_void>
       *this,handle src,bool convert)

{
  long lVar1;
  _Head_base<0UL,_Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_*,_false>
  _Var2;
  bool bVar3;
  _Head_base<0UL,_Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_*,_false>
  expr;
  pointer __p;
  Array aref;
  handle local_68;
  EigenConformable<false> local_60;
  
  bVar3 = array_t<double,_18>::check_(src);
  if (bVar3) {
    local_68.m_ptr = src.m_ptr;
    if (src.m_ptr != (PyObject *)0x0) {
      (src.m_ptr)->ob_refcnt = (src.m_ptr)->ob_refcnt + 1;
      EigenProps<Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>_>
      ::conformable(&local_60,(array *)&local_68);
      if ((local_60.conformable & 1U) == 0) goto LAB_001b6360;
      if (((local_60.negativestrides & 1U) == 0) &&
         (local_60.rows == 1 || local_60.stride.m_inner.m_value == 1)) {
        object::operator=((object *)&this->copy_or_ref,(object *)&local_68);
        goto LAB_001b62ce;
      }
    }
    object::~object((object *)&local_68);
  }
  if (!convert) {
    return false;
  }
  array_t<double,_18>::ensure((array_t<double,_18> *)&local_68,src);
  if ((((local_68.m_ptr != (PyObject *)0x0) &&
       (EigenProps<Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>_>
        ::conformable(&local_60,(array *)&local_68), (local_60.conformable & 1U) != 0)) &&
      ((local_60.negativestrides & 1U) == 0)) &&
     (local_60.rows == 1 || local_60.stride.m_inner.m_value == 1)) {
    object::operator=((object *)&this->copy_or_ref,(object *)&local_68);
    loader_life_support::add_patient
              ((this->copy_or_ref).super_array.super_buffer.super_object.super_handle.m_ptr);
LAB_001b62ce:
    object::~object((object *)&local_68);
    std::
    __uniq_ptr_impl<Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_std::default_delete<Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>_>_>
    ::reset((__uniq_ptr_impl<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_std::default_delete<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>_>
             *)&this->ref,(pointer)0x0);
    expr._M_head_impl =
         (Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *)
         operator_new(0x18);
    lVar1 = (this->copy_or_ref).super_array.super_buffer.super_object.super_handle.m_ptr[1].
            ob_refcnt;
    *(long *)&(expr._M_head_impl)->
              super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
         = lVar1;
    ((variable_if_dynamic<long,__1> *)
    ((long)&(expr._M_head_impl)->
            super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
    + 8))->m_value = local_60.rows;
    if (local_60.cols != 1) {
      __assert_fail("v == T(Value)",
                    "/workspace/llm4binary/github/license_c_cmakelists/oberbichler[P]ANurbs/external_libraries/Eigen/src/Core/util/XprHelper.h"
                    ,0x6e,
                    "Eigen::internal::variable_if_dynamic<long, 1>::variable_if_dynamic(T) [T = long, Value = 1]"
                   );
    }
    if (local_60.rows < 0 && lVar1 != 0) {
      __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/oberbichler[P]ANurbs/external_libraries/Eigen/src/Core/MapBase.h"
                    ,0xb0,
                    "Eigen::MapBase<Eigen::Map<const Eigen::Matrix<double, -1, 1>, 0, Eigen::InnerStride<1>>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Map<const Eigen::Matrix<double, -1, 1>, 0, Eigen::InnerStride<1>>, Level = 0]"
                   );
    }
    _Var2._M_head_impl =
         (this->map)._M_t.
         super___uniq_ptr_impl<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_std::default_delete<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_*,_std::default_delete<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>_>
         .
         super__Head_base<0UL,_Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_*,_false>
         ._M_head_impl;
    (this->map)._M_t.
    super___uniq_ptr_impl<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_std::default_delete<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_*,_std::default_delete<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>_>
    .
    super__Head_base<0UL,_Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_*,_false>
    ._M_head_impl = expr._M_head_impl;
    if (_Var2._M_head_impl !=
        (Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *)0x0) {
      operator_delete(_Var2._M_head_impl,0x18);
      expr._M_head_impl =
           (this->map)._M_t.
           super___uniq_ptr_impl<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_std::default_delete<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_*,_std::default_delete<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>_>
           .
           super__Head_base<0UL,_Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_*,_false>
           ._M_head_impl;
    }
    __p = (pointer)operator_new(0x28);
    (__p->
    super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
    ).
    super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
    .m_data = (PointerType)0x0;
    (__p->
    super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
    ).
    super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
    .m_rows.m_value = 0;
    (__p->m_object).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
         = (double *)0x0;
    (__p->m_object).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
         = 0;
    Eigen::RefBase<Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>>::
    construct<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>>const>
              ((RefBase<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>>>
                *)__p,expr._M_head_impl);
    std::
    __uniq_ptr_impl<Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_std::default_delete<Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>_>_>
    ::reset((__uniq_ptr_impl<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_std::default_delete<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>_>
             *)&this->ref,__p);
    return true;
  }
LAB_001b6360:
  object::~object((object *)&local_68);
  return false;
}

Assistant:

bool load(handle src, bool convert) {
        // First check whether what we have is already an array of the right type.  If not, we can't
        // avoid a copy (because the copy is also going to do type conversion).
        bool need_copy = !isinstance<Array>(src);

        EigenConformable<props::row_major> fits;
        if (!need_copy) {
            // We don't need a converting copy, but we also need to check whether the strides are
            // compatible with the Ref's stride requirements
            Array aref = reinterpret_borrow<Array>(src);

            if (aref && (!need_writeable || aref.writeable())) {
                fits = props::conformable(aref);
                if (!fits) return false; // Incompatible dimensions
                if (!fits.template stride_compatible<props>())
                    need_copy = true;
                else
                    copy_or_ref = std::move(aref);
            }
            else {
                need_copy = true;
            }
        }

        if (need_copy) {
            // We need to copy: If we need a mutable reference, or we're not supposed to convert
            // (either because we're in the no-convert overload pass, or because we're explicitly
            // instructed not to copy (via `py::arg().noconvert()`) we have to fail loading.
            if (!convert || need_writeable) return false;

            Array copy = Array::ensure(src);
            if (!copy) return false;
            fits = props::conformable(copy);
            if (!fits || !fits.template stride_compatible<props>())
                return false;
            copy_or_ref = std::move(copy);
            loader_life_support::add_patient(copy_or_ref);
        }

        ref.reset();
        map.reset(new MapType(data(copy_or_ref), fits.rows, fits.cols, make_stride(fits.stride.outer(), fits.stride.inner())));
        ref.reset(new Type(*map));

        return true;
    }